

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

void Mio_LibraryTransferCellIds(void)

{
  int iVar1;
  Mio_Library_t *pLib_00;
  SC_Lib *p;
  char *pcVar2;
  int CellId;
  SC_Lib *pScl;
  Mio_Library_t *pLib;
  Mio_Gate_t *pGate;
  
  pLib_00 = (Mio_Library_t *)Abc_FrameReadLibGen();
  p = (SC_Lib *)Abc_FrameReadLibScl();
  if (p == (SC_Lib *)0x0) {
    printf("SC library cannot be found.\n");
  }
  else if (pLib_00 == (Mio_Library_t *)0x0) {
    printf("Genlib library cannot be found.\n");
  }
  else {
    for (pLib = (Mio_Library_t *)Mio_LibraryReadGates(pLib_00); pLib != (Mio_Library_t *)0x0;
        pLib = (Mio_Library_t *)Mio_GateReadNext((Mio_Gate_t *)pLib)) {
      iVar1 = Mio_GateReadPinNum((Mio_Gate_t *)pLib);
      if (iVar1 != 0) {
        pcVar2 = Mio_GateReadName((Mio_Gate_t *)pLib);
        iVar1 = Abc_SclCellFind(p,pcVar2);
        if (iVar1 < 0) {
          pcVar2 = Mio_GateReadName((Mio_Gate_t *)pLib);
          printf("Cannot find cell ID of gate %s.\n",pcVar2);
        }
        else {
          Mio_GateSetCell((Mio_Gate_t *)pLib,iVar1);
        }
      }
    }
  }
  return;
}

Assistant:

void Mio_LibraryTransferCellIds()
{
    Mio_Gate_t * pGate;
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    SC_Lib * pScl = (SC_Lib *)Abc_FrameReadLibScl();
    int CellId;
    if ( pScl == NULL )
    {
        printf( "SC library cannot be found.\n" );
        return;
    }
    if ( pLib == NULL )
    {
        printf( "Genlib library cannot be found.\n" );
        return;
    }
    Mio_LibraryForEachGate( pLib, pGate )
    {
        if ( Mio_GateReadPinNum(pGate) == 0 )
            continue;
        CellId = Abc_SclCellFind( pScl, Mio_GateReadName(pGate) );
        if ( CellId < 0 )
            printf( "Cannot find cell ID of gate %s.\n", Mio_GateReadName(pGate) );
        else
            Mio_GateSetCell( pGate, CellId );
    }
}